

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

bool __thiscall cppcms::json::value::load(value *this,istream *in,bool full,int *line_number)

{
  bool bVar1;
  int err_line;
  int local_c;
  
  bVar1 = anon_unknown_9::parse_stream(in,this,full,&local_c);
  if (line_number != (int *)0x0 && !bVar1) {
    *line_number = local_c;
  }
  return bVar1;
}

Assistant:

bool value::load(std::istream &in,bool full,int *line_number)
	{
		int err_line;
		if(!parse_stream(in,*this,full,err_line)) {
			if(line_number)
				*line_number=err_line;
			return false;
		}
		return true;

	}